

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  uint uVar1;
  uint uVar2;
  quint32 qVar3;
  uchar *puVar4;
  FetchAndConvertPixelsFunc p_Var5;
  QList<unsigned_int> *pQVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  IntermediateBuffer intermediate;
  IntermediateBuffer local_4048;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar20 = *fy >> 0x10;
  iVar17 = image->y2 + -1;
  iVar8 = iVar20 + 1;
  if (iVar17 <= iVar20) {
    iVar8 = iVar17;
  }
  iVar21 = image->y1;
  if (iVar20 < iVar17) {
    iVar17 = iVar20;
  }
  if (iVar20 < iVar21) {
    iVar17 = iVar21;
    iVar8 = iVar21;
  }
  uVar16 = (uint)*fy >> 8 & 0xff;
  puVar4 = image->imageData;
  lVar18 = image->bytesPerLine;
  iVar21 = (int)((ulong)((long)end - (long)b) >> 2);
  iVar20 = (fdx >> 0x1f & iVar21 * fdx) + *fx >> 0x10;
  uVar13 = (ulong)(uint)-fdx;
  if (0 < fdx) {
    uVar13 = (ulong)(uint)fdx;
  }
  lVar14 = uVar13 * (long)iVar21;
  lVar15 = lVar14 + 0xffff;
  lVar14 = lVar14 + 0x1fffe;
  if (-1 < lVar15) {
    lVar14 = lVar15;
  }
  iVar21 = image->x1;
  iVar7 = iVar21;
  if (iVar21 < iVar20) {
    iVar7 = iVar20;
  }
  iVar9 = (int)((ulong)lVar14 >> 0x10);
  iVar19 = iVar20 + iVar9 + 2;
  iVar22 = image->x2;
  if (iVar19 < image->x2) {
    iVar22 = iVar19;
  }
  p_Var5 = qPixelLayouts[image->format].fetchToARGB32PM;
  uVar13 = 1;
  if (1 < iVar22 - iVar7) {
    uVar13 = (ulong)(uint)(iVar22 - iVar7);
  }
  pQVar6 = image->colorTable;
  iVar9 = iVar9 + 2;
  uVar10 = iVar7 - iVar20;
  uVar23 = 0;
  iVar22 = (int)uVar13;
  puVar11 = (*p_Var5)(local_4048.buffer_rb + (int)uVar10,puVar4 + iVar17 * lVar18,iVar7,iVar22,
                      pQVar6,(QDitherInfo *)0x0);
  puVar12 = (*p_Var5)(local_4048.buffer_ag + (int)uVar10,puVar4 + iVar8 * lVar18,iVar7,iVar22,pQVar6
                      ,(QDitherInfo *)0x0);
  lVar15 = (long)iVar20;
  lVar18 = (long)iVar21;
  if (iVar21 <= lVar15) {
    lVar18 = lVar15;
  }
  lVar18 = lVar18 * 4 + lVar15 * -4;
  do {
    uVar1 = puVar11[uVar23];
    uVar2 = puVar12[uVar23];
    *(uint *)((long)&local_4048 + uVar23 * 4 + lVar18) =
         (uVar2 & 0xff00ff) * uVar16 + (uVar1 & 0xff00ff) * (0x100 - uVar16) >> 8 & 0xff00ff;
    *(uint *)((long)&local_4048 + uVar23 * 4 + lVar18 + 0x2008) =
         (uVar2 >> 8 & 0xff00ff) * uVar16 + (uVar1 >> 8 & 0xff00ff) * (0x100 - uVar16) >> 8 &
         0xff00ff;
    uVar23 = uVar23 + 1;
  } while (uVar13 != uVar23);
  if (0 < (int)uVar10) {
    uVar13 = 0;
    do {
      local_4048.buffer_rb[uVar13] = local_4048.buffer_rb[(int)uVar10];
      local_4048.buffer_ag[uVar13] = local_4048.buffer_ag[(int)uVar10];
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  if ((int)(iVar22 + uVar10) < iVar9) {
    lVar18 = (long)(int)(iVar22 + uVar10);
    qVar3 = local_4048.buffer_ag[lVar18 + -1];
    do {
      local_4048.buffer_rb[lVar18] = local_4048.buffer_rb[lVar18 + -1];
      local_4048.buffer_ag[lVar18] = qVar3;
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar9);
  }
  intermediate_adder(b,end,&local_4048,iVar20,fx,fdx);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                     int &fx, int &fy, int fdx, int /*fdy*/)
{
    const QPixelLayout *layout = &qPixelLayouts[image.format];
    const QList<QRgb> *clut = image.colorTable;
    const FetchAndConvertPixelsFunc fetch = layout->fetchToARGB32PM;

    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uchar *s1 = image.scanLine(y1);
    const uchar *s2 = image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    uint *buf1 = intermediate.buffer_rb;
    uint *buf2 = intermediate.buffer_ag;
    const uint *ptr1;
    const uint *ptr2;

    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    Q_ASSERT(count <= BufferSize + 2);

    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0)
            x += image.width;
        int len1 = qMin(count, image.width - x);
        int len2 = qMin(x, count - len1);

        ptr1 = fetch(buf1, s1, x, len1, clut, nullptr);
        ptr2 = fetch(buf2, s2, x, len1, clut, nullptr);
        for (int i = 0; i < len1; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        if (len2) {
            ptr1 = fetch(buf1 + len1, s1, 0, len2, clut, nullptr);
            ptr2 = fetch(buf2 + len1, s2, 0, len2, clut, nullptr);
            for (int i = 0; i < len2; ++i) {
                uint t = ptr1[i];
                uint b = ptr2[i];
                buf1[i + len1] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
                buf2[i + len1] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            }
        }
        // Generate the rest by repeatedly repeating the previous set of pixels
        for (int i = image.width; i < count; ++i) {
            buf1[i] = buf1[i - image.width];
            buf2[i] = buf2[i - image.width];
        }
    } else {
        int start = qMax(x, image.x1);
        int end = qMin(x + count, image.x2);
        int len = qMax(1, end - start);
        int leading = start - x;

        ptr1 = fetch(buf1 + leading, s1, start, len, clut, nullptr);
        ptr2 = fetch(buf2 + leading, s2, start, len, clut, nullptr);

        for (int i = 0; i < len; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i + leading] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i + leading] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        for (int i = 0; i < leading; ++i) {
            buf1[i] = buf1[leading];
            buf2[i] = buf2[leading];
        }
        for (int i = leading + len; i < count; ++i) {
            buf1[i] = buf1[i - 1];
            buf2[i] = buf2[i - 1];
        }
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}